

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::anon_unknown_2::trailingBytes(uchar c)

{
  ReusableStringStream *pRVar1;
  SourceLineInfo local_60;
  ReusableStringStream local_50;
  string local_38;
  uchar local_11;
  size_t sStack_10;
  uchar c_local;
  
  if ((c & 0xe0) == 0xc0) {
    sStack_10 = 2;
  }
  else if ((c & 0xf0) == 0xe0) {
    sStack_10 = 3;
  }
  else {
    if ((c & 0xf8) != 0xf0) {
      local_11 = c;
      ReusableStringStream::ReusableStringStream(&local_50);
      SourceLineInfo::SourceLineInfo
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/catch2/catch.hpp"
                 ,0x3c62);
      pRVar1 = ReusableStringStream::operator<<(&local_50,&local_60);
      pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [26])": Internal Catch2 error: ");
      pRVar1 = ReusableStringStream::operator<<
                         (pRVar1,(char (*) [47])"Invalid multibyte utf-8 start byte encountered");
      ReusableStringStream::str_abi_cxx11_(&local_38,pRVar1);
      throw_logic_error(&local_38);
    }
    sStack_10 = 4;
  }
  return sStack_10;
}

Assistant:

size_t trailingBytes(unsigned char c) {
        if ((c & 0xE0) == 0xC0) {
            return 2;
        }
        if ((c & 0xF0) == 0xE0) {
            return 3;
        }
        if ((c & 0xF8) == 0xF0) {
            return 4;
        }
        CATCH_INTERNAL_ERROR("Invalid multibyte utf-8 start byte encountered");
    }